

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O1

bool OpenMD::invertMatrix<OpenMD::DynamicRectMatrix<double>>
               (DynamicRectMatrix<double> *A,DynamicRectMatrix<double> *AI,uint size,int *tmp1Size,
               ElemPoinerType tmp2Size)

{
  uint uVar1;
  double **ppdVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar1 = A->nrow_;
  bVar7 = false;
  if ((((uVar1 == size) && (uVar1 == A->ncol_)) && (uVar1 == AI->nrow_)) &&
     (bVar7 = false, A->ncol_ == AI->ncol_)) {
    iVar3 = LUFactorLinearSystem<OpenMD::DynamicRectMatrix<double>>(A,tmp1Size,size,tmp2Size);
    bVar7 = iVar3 != 0;
    if (size != 0 && bVar7) {
      uVar6 = (ulong)size;
      uVar5 = 0;
      do {
        memset(tmp2Size,0,uVar6 * 8);
        tmp2Size[uVar5] = 1.0;
        LUSolveLinearSystem<OpenMD::DynamicRectMatrix<double>>(A,tmp1Size,tmp2Size,size);
        ppdVar2 = AI->data_;
        uVar4 = 0;
        do {
          ppdVar2[uVar4][uVar5] = tmp2Size[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar6 != uVar4);
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar6);
    }
  }
  return bVar7;
}

Assistant:

bool invertMatrix(MatrixType& A, MatrixType& AI, unsigned int size,
                    int* tmp1Size,
                    typename MatrixType::ElemPoinerType tmp2Size) {
    if (A.getNRow() != A.getNCol() || A.getNRow() != AI.getNRow() ||
        A.getNCol() != AI.getNCol() || A.getNRow() != size) {
      return false;
    }

    unsigned int i, j;

    //
    // Factor matrix; then begin solving for inverse one column at a time.
    // Note: tmp1Size returned value is used later, tmp2Size is just working
    // memory whose values are not used in LUSolveLinearSystem
    //
    if (LUFactorLinearSystem(A, tmp1Size, size, tmp2Size) == 0) {
      return false;
    }

    for (j = 0; j < size; ++j) {
      for (i = 0; i < size; ++i) {
        tmp2Size[i] = 0.0;
      }
      tmp2Size[j] = 1.0;

      LUSolveLinearSystem(A, tmp1Size, tmp2Size, size);

      for (i = 0; i < size; i++) {
        AI(i, j) = tmp2Size[i];
      }
    }

    return true;
  }